

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

void md_free_ref_def_hashtable(MD_CTX *ctx)

{
  void *__ptr;
  long in_RDI;
  void *bucket;
  int i;
  int local_c;
  
  if (*(long *)(in_RDI + 0x80) != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x88); local_c = local_c + 1) {
      __ptr = *(void **)(*(long *)(in_RDI + 0x80) + (long)local_c * 8);
      if ((__ptr != (void *)0x0) &&
         ((__ptr < *(void **)(in_RDI + 0x70) ||
          ((void *)(*(long *)(in_RDI + 0x70) + (long)*(int *)(in_RDI + 0x78) * 0x28) <= __ptr)))) {
        free(__ptr);
      }
    }
    free(*(void **)(in_RDI + 0x80));
  }
  return;
}

Assistant:

static void
md_free_ref_def_hashtable(MD_CTX* ctx)
{
    if(ctx->ref_def_hashtable != NULL) {
        int i;

        for(i = 0; i < ctx->ref_def_hashtable_size; i++) {
            void* bucket = ctx->ref_def_hashtable[i];
            if(bucket == NULL)
                continue;
            if(ctx->ref_defs <= (MD_REF_DEF*) bucket  &&  (MD_REF_DEF*) bucket < ctx->ref_defs + ctx->n_ref_defs)
                continue;
            free(bucket);
        }

        free(ctx->ref_def_hashtable);
    }
}